

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xvector.c
# Opt level: O3

void xvec_erase(xvec_t *xv,size_t pos,int count)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  uchar *__src;
  uchar *puVar6;
  
  if (-1 < count) {
    uVar1 = (uint)count + pos;
    if (uVar1 < xv->size) {
      sVar3 = xv->size - (ulong)(uint)count;
      xv->size = sVar3;
      sVar2 = xv->val_size;
      puVar6 = xv->data;
      if (xv->destroy_cb == (xvec_destroy_cb)0x0) {
        __src = puVar6 + uVar1 * sVar2;
      }
      else {
        __src = puVar6 + sVar2 * pos;
        if (count != 0) {
          uVar4 = count + 1;
          do {
            (*xv->destroy_cb)(__src);
            sVar2 = xv->val_size;
            __src = __src + sVar2;
            uVar4 = uVar4 - 1;
          } while (1 < uVar4);
          sVar3 = xv->size;
          puVar6 = xv->data;
        }
      }
      memmove(puVar6 + sVar2 * pos,__src,(sVar3 - pos) * sVar2);
      return;
    }
  }
  if (xv->destroy_cb != (xvec_destroy_cb)0x0) {
    iVar5 = (int)xv->size;
    if (0 < iVar5 - (int)pos) {
      puVar6 = xv->data + xv->val_size * pos;
      uVar4 = (iVar5 - (int)pos) + 1;
      do {
        (*xv->destroy_cb)(puVar6);
        puVar6 = puVar6 + xv->val_size;
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
  }
  xv->size = pos;
  return;
}

Assistant:

void xvec_erase(xvec_t* xv, size_t pos, int count)
{
    unsigned char* v;

    if (count < 0 || pos + count >= xv->size)
    {
        if (xv->destroy_cb)
            values_destroy(xv, pos, xv->size - pos);

        xv->size = pos;
    }
    else
    {
        xv->size -= count;

        if (xv->destroy_cb)
            v = values_destroy(xv, pos, count);
        else
            v = xvec_at(xv, pos + count);

        /* <<< */
        memmove(xvec_at(xv, pos), v,
                xv->val_size * (xv->size - pos));
    }
}